

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          string *stdLibString)

{
  ostream *poVar1;
  string rpath_link;
  ostringstream fout;
  string sStack_1d8;
  string local_1b8;
  ostream local_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  ComputeRPath_abi_cxx11_(&sStack_1d8,this,cli);
  std::operator<<(&local_198,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  ComputeLinkLibs_abi_cxx11_(&sStack_1d8,this,cli);
  std::operator<<(&local_198,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&sStack_1d8,cli);
  if (((cli->RPathLinkFlag)._M_string_length != 0) && (sStack_1d8._M_string_length != 0)) {
    std::operator<<(&local_198,(string *)&cli->RPathLinkFlag);
    cmOutputConverter::EscapeForShell
              (&local_1b8,this->OutputConverter,&sStack_1d8,(bool)(this->ForResponse ^ 1),false,
               false);
    std::operator<<(&local_198,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::operator<<(&local_198," ");
  }
  if (stdLibString->_M_string_length != 0) {
    poVar1 = std::operator<<(&local_198,(string *)stdLibString);
    std::operator<<(poVar1," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  std::ostringstream fout;
  fout << this->ComputeRPath(cli);

  // Write the library flags to the build rule.
  fout << this->ComputeLinkLibs(cli);

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if (!cli.GetRPathLinkFlag().empty() && !rpath_link.empty()) {
    fout << cli.GetRPathLinkFlag();
    fout << this->OutputConverter->EscapeForShell(rpath_link,
                                                  !this->ForResponse);
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}